

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O2

void findSwitches(string *filename,string *outfile,string *reference)

{
  int iVar1;
  int iVar2;
  value_type *pvVar3;
  char cVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  runtime_error *this;
  value_type *__x;
  ulong uVar7;
  uint s;
  uint uVar8;
  long lVar9;
  uint local_a0c;
  BamReader bamreader;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codes;
  string alignSequence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RSCodes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FSCodes;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indRSTotalScores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RSQualCodes;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> indFSTotalScores;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FSQualCodes;
  vector<int,_std::allocator<int>_> qualityList;
  vector<char,_std::allocator<char>_> cigar;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  RSSwitchMap;
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  FSSwitchMap;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  _Vector_base<int,_std::allocator<int>_> local_7b0;
  _Vector_base<int,_std::allocator<int>_> local_798;
  _Vector_base<char,_std::allocator<char>_> local_780;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSQualScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSSwitchScoresFrequency
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> RSReadScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSQualScoresFrequency;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSSwitchScoresFrequency
  ;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> FSReadScoresFrequency;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  BamAlignment alignment;
  string local_560 [64];
  string local_520 [68];
  int local_4dc;
  value_type *local_4d0;
  value_type *local_4c8;
  ofstream FSSwitchFile;
  string local_418 [32];
  string local_3f8 [456];
  ofstream RSSwitchFile;
  
  BamTools::BamReader::BamReader(&bamreader);
  cVar4 = BamTools::BamReader::Open((string *)&bamreader);
  if (cVar4 == '\0') {
    BamTools::BamReader::GetFilename_abi_cxx11_();
    poVar5 = std::operator<<((ostream *)&std::cerr,(string *)&FSSwitchFile);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&FSSwitchFile);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Couldn\'t open Bamfile");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  BamTools::BamAlignment::BamAlignment(&alignment);
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  FSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indFSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indFSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indFSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  RSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  RSCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indRSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  RSQualCodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  indRSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indRSTotalScores.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0c = 0;
  RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       RSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSQualScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSSwitchScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       FSReadScoresFrequency._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    cVar4 = BamTools::BamReader::GetNextAlignment((BamAlignment *)&bamreader);
    pvVar3 = local_4c8;
    if (cVar4 == '\0') {
      lVar9 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)FSCodes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)FSCodes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1)
      {
        std::__cxx11::string::string
                  ((string *)&local_5e8,
                   (string *)
                   ((long)&((FSCodes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        std::__cxx11::string::string
                  ((string *)&local_608,
                   (string *)
                   ((long)&((FSQualCodes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        scoreIndividualReads
                  (&local_5e8,&local_608,&FSReadScoresFrequency,&FSSwitchScoresFrequency,
                   &FSQualScoresFrequency,&indFSTotalScores,&FSSwitchMap);
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_5e8);
        lVar9 = lVar9 + 0x20;
      }
      lVar9 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)RSCodes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)RSCodes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1)
      {
        std::__cxx11::string::string
                  ((string *)&local_628,
                   (string *)
                   ((long)&((RSCodes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        std::__cxx11::string::string
                  ((string *)&local_648,
                   (string *)
                   ((long)&((RSQualCodes.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        scoreIndividualReads
                  (&local_628,&local_648,&RSReadScoresFrequency,&RSSwitchScoresFrequency,
                   &RSQualScoresFrequency,&indRSTotalScores,&RSSwitchMap);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::~string((string *)&local_628);
        lVar9 = lVar9 + 0x20;
      }
      std::ofstream::ofstream(&FSSwitchFile);
      std::ofstream::ofstream(&RSSwitchFile);
      std::operator+(&alignSequence,outfile,"FSSwitches.txt");
      std::ofstream::open((string *)&FSSwitchFile,(_Ios_Openmode)&alignSequence);
      std::__cxx11::string::~string((string *)&alignSequence);
      std::operator+(&alignSequence,outfile,"RSSwitches.txt");
      std::ofstream::open((string *)&RSSwitchFile,(_Ios_Openmode)&alignSequence);
      std::__cxx11::string::~string((string *)&alignSequence);
      for (p_Var6 = FSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &FSSwitchMap._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        iVar1 = *(int *)&p_Var6[1].field_0x4;
        iVar2 = *(int *)&p_Var6[1]._M_parent;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&FSSwitchFile,p_Var6[1]._M_color);
        std::operator<<(poVar5,"    ");
        poVar5 = std::ostream::_M_insert<double>((double)iVar1 / (double)(iVar2 + iVar1));
        poVar5 = std::operator<<(poVar5,"    ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,*(int *)&p_Var6[1].field_0x4 + *(int *)&p_Var6[1]._M_parent);
        poVar5 = std::operator<<(poVar5,"    ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var6[1].field_0x4);
        poVar5 = std::operator<<(poVar5,"    ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var6[1]._M_parent);
        std::operator<<(poVar5,'\n');
      }
      for (p_Var6 = RSSwitchMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &RSSwitchMap._M_t._M_impl.super__Rb_tree_header;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        iVar1 = *(int *)&p_Var6[1].field_0x4;
        iVar2 = *(int *)&p_Var6[1]._M_parent;
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)&RSSwitchFile,p_Var6[1]._M_color);
        std::operator<<(poVar5,"    ");
        poVar5 = std::ostream::_M_insert<double>((double)iVar1 / (double)(iVar2 + iVar1));
        poVar5 = std::operator<<(poVar5,"    ");
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,*(int *)&p_Var6[1].field_0x4 + *(int *)&p_Var6[1]._M_parent);
        poVar5 = std::operator<<(poVar5,"    ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var6[1].field_0x4);
        poVar5 = std::operator<<(poVar5,"    ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(int *)&p_Var6[1]._M_parent);
        std::operator<<(poVar5,'\n');
      }
      std::ofstream::~ofstream(&RSSwitchFile);
      std::ofstream::~ofstream(&FSSwitchFile);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&indRSTotalScores.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&RSQualScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&RSSwitchScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&RSReadScoresFrequency._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&RSQualCodes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&RSCodes);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&indFSTotalScores.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&FSQualScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&FSSwitchScoresFrequency._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&FSReadScoresFrequency._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&FSQualCodes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&FSCodes);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&RSSwitchMap._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_int,_std::pair<int,_int>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
      ::~_Rb_tree(&FSSwitchMap._M_t);
      BamTools::BamAlignment::~BamAlignment(&alignment);
      BamTools::BamReader::~BamReader(&bamreader);
      return;
    }
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    cigar.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    for (__x = local_4d0; __x != pvVar3; __x = __x + 8) {
      for (uVar8 = 0; uVar8 < *(uint *)(__x + 4); uVar8 = uVar8 + 1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)
                   &cigar.super__Vector_base<char,_std::allocator<char>_>,__x);
      }
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_780,
               (vector<char,_std::allocator<char>_> *)
               &cigar.super__Vector_base<char,_std::allocator<char>_>);
    iVar1 = local_4dc;
    std::__cxx11::string::string((string *)&local_5a8,local_560);
    std::__cxx11::string::string((string *)&local_5c8,local_520);
    referenceString((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)&FSSwitchFile,(vector<char,_std::allocator<char>_> *)&local_780,iVar1,
                    &local_5a8,reference,&local_5c8);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_780);
    std::__cxx11::string::string((string *)&RSSwitchFile,local_3f8);
    std::__cxx11::string::string((string *)&alignSequence,local_418);
    std::vector<int,_std::allocator<int>_>::vector
              (&qualityList,(vector<int,_std::allocator<int>_> *)&FSSwitchFile);
    cVar4 = BamTools::BamAlignment::IsPaired();
    if (cVar4 == '\0') {
      cVar4 = BamTools::BamAlignment::IsReverseStrand();
LAB_001072cf:
      if (cVar4 != '\0') goto LAB_001072d7;
LAB_0010740c:
      std::__cxx11::string::string((string *)&local_7d0,(string *)&RSSwitchFile);
      std::__cxx11::string::string((string *)&local_7f0,(string *)&alignSequence);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_798,&qualityList);
      FFSAndFRSSwitchDetermination
                (&codes,&local_7d0,&local_7f0,(vector<int,_std::allocator<int>_> *)&local_798,
                 &FSSwitchMap,'G','C','T');
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_798);
      std::__cxx11::string::~string((string *)&local_7f0);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&FSCodes,codes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&FSQualCodes,
                  codes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&codes);
      local_a0c = 1;
    }
    else {
      cVar4 = BamTools::BamAlignment::IsFirstMate();
      if (cVar4 != '\0') {
        cVar4 = BamTools::BamAlignment::IsReverseStrand();
        goto LAB_001072cf;
      }
      cVar4 = BamTools::BamAlignment::IsSecondMate();
      if (cVar4 != '\0') {
        local_a0c = BamTools::BamAlignment::IsReverseStrand();
      }
      if ((local_a0c & 1) != 0) goto LAB_0010740c;
LAB_001072d7:
      std::__cxx11::string::string((string *)&local_830,(string *)&RSSwitchFile);
      complement(&local_810,&local_830);
      std::__cxx11::string::string((string *)&local_870,(string *)&alignSequence);
      complement(&local_850,&local_870);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_7b0,&qualityList);
      RFSAndRRSSwitchDetermination
                (&codes,&local_810,&local_850,(vector<int,_std::allocator<int>_> *)&local_7b0,
                 &RSSwitchMap,'G','C','T');
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_7b0);
      std::__cxx11::string::~string((string *)&local_850);
      std::__cxx11::string::~string((string *)&local_870);
      std::__cxx11::string::~string((string *)&local_810);
      std::__cxx11::string::~string((string *)&local_830);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&RSCodes,codes.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&RSQualCodes,
                  codes.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&codes);
      local_a0c = 0;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&qualityList.super__Vector_base<int,_std::allocator<int>_>);
    std::__cxx11::string::~string((string *)&alignSequence);
    std::__cxx11::string::~string((string *)&RSSwitchFile);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&FSSwitchFile);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&cigar.super__Vector_base<char,_std::allocator<char>_>);
  } while( true );
}

Assistant:

void findSwitches(string filename , string outfile, string & reference) {
    BamTools::BamReader bamreader;
    if (not bamreader.Open(filename)) {
        cerr << bamreader.GetFilename() << endl;
        throw std::runtime_error("Couldn't open Bamfile");
    }
    BamTools::BamAlignment alignment;
    std::map<int,std::pair<int,int>> FSSwitchMap;// map containg switch and nonswitch values for FS reads
    std::map<int,std::pair<int,int>> RSSwitchMap;// map containg switch and nonswitch values for RS reads
    vector<string> FSCodes;
    vector<string> FSQualCodes;
    std::map<int,int> FSReadScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> FSSwitchScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> FSQualScoresFrequency;// map contating the score frequencies for FS reads
    std::vector<pair<int,int>> indFSTotalScores;// vector contating the individual score for FS reads
    vector<string> RSCodes;
    vector<string> RSQualCodes;
    std::map<int,int> RSReadScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> RSSwitchScoresFrequency;// map contating the score frequencies for FS reads
    std::map<int,int> RSQualScoresFrequency;// map contating the score frequencies for FS reads
    std::vector<pair<int,int>> indRSTotalScores;// map contating the individual score for RS reads

    while (bamreader.GetNextAlignment(alignment)){
        std::vector<char> cigar;
        for (const auto& it : alignment.CigarData) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                cigar.push_back(it.Type);
            }
        }
        std::tuple<string,string,vector<int>> ref = referenceString(cigar,alignment.Position,alignment.QueryBases,reference,alignment.Qualities);
        string constructedReference = std::get<0>(ref);
        string alignSequence = std::get<1>(ref);
        vector<int> qualityList = std::get<2>(ref);


        bool strand1;
        if(!alignment.IsPaired()){
        strand1 = !alignment.IsReverseStrand();
        }else{
            if(alignment.IsFirstMate()){
                if(!alignment.IsReverseStrand()){
                    strand1=true;
                }else{
                    strand1=false;
                }
            }else if(alignment.IsSecondMate()){
                if(!alignment.IsReverseStrand()){
                    strand1=false;
                }else{
                    strand1=true;
                }
            }
        }

        // All the reads in a bam file are stored in the forward direction. So for OT and CTOT we dont chenge anything since they are forward reads
        // For OB and CTOB we take the compliment of both since we want both to be aligned to the reverse strand
        if(strand1){//OT nad CTOT
            vector<string> codes= FFSAndFRSSwitchDetermination(constructedReference,alignSequence,qualityList,FSSwitchMap,'G','C','T');
            FSCodes.push_back(codes[0]);
            FSQualCodes.push_back(codes[1]);
        }else if(!strand1){//OB and CTOB
            vector<string> codes= RFSAndRRSSwitchDetermination(complement(constructedReference),complement(alignSequence),qualityList,RSSwitchMap,'G','C','T');
            RSCodes.push_back(codes[0]);
            RSQualCodes.push_back(codes[1]);
        }


    }

    //Scoring forward strand reads
    for(int i = 0; i<FSCodes.size(); i++){
        scoreIndividualReads(FSCodes[i],FSQualCodes[i],FSReadScoresFrequency,FSSwitchScoresFrequency,FSQualScoresFrequency,indFSTotalScores,FSSwitchMap);
    }
    //Scoring reverse strand reads
    for(int i = 0; i<RSCodes.size(); i++){
        scoreIndividualReads(RSCodes[i],RSQualCodes[i],RSReadScoresFrequency,RSSwitchScoresFrequency,RSQualScoresFrequency,indRSTotalScores,RSSwitchMap);
    }



    ofstream FSSwitchFile;
    ofstream RSSwitchFile;

    FSSwitchFile.open (outfile+"FSSwitches.txt");
    RSSwitchFile.open (outfile+"RSSwitches.txt");

    //Outfile(switchrates) format: distance | switch/switch+nonSwitch | switch+nonSwitch | switch | nonSwitch

    std::map<int,std::pair<int,int>>::iterator it = FSSwitchMap.begin();
    for (it=FSSwitchMap.begin(); it!=FSSwitchMap.end(); ++it){
        double stat;
        stat = it->second.first/(double)(it->second.second+it->second.first);
        FSSwitchFile << it->first << "    " << stat <<"    "<<it->second.second+it->second.first<<"    "<<it->second.first<<"    "<<it->second.second<< '\n';

    }


    std::map<int,std::pair<int,int>>::iterator it3 = RSSwitchMap.begin();
    for (it3=RSSwitchMap.begin(); it3!=RSSwitchMap.end(); ++it3){
        double stat;
        stat = it3->second.first/(double)(it3->second.second+it3->second.first);
        RSSwitchFile << it3->first << "    " << stat <<"    "<<it3->second.second+it3->second.first<<"    "<<it3->second.first<<"    "<<it3->second.second<< '\n';

    }

}